

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::clear_value
          (CustomLayerParams_CustomLayerParamValue *this)

{
  if (this->_oneof_case_[0] == 0x14) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArena
              (&(this->value_).stringvalue_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void CustomLayerParams_CustomLayerParamValue::clear_value() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  switch (value_case()) {
    case kDoubleValue: {
      // No need to clear
      break;
    }
    case kStringValue: {
      value_.stringvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kIntValue: {
      // No need to clear
      break;
    }
    case kLongValue: {
      // No need to clear
      break;
    }
    case kBoolValue: {
      // No need to clear
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = VALUE_NOT_SET;
}